

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerImpl::GetBbrDataset
          (CommissionerImpl *this,Handler<BbrDataset> *aHandler,uint16_t aDatasetFlags)

{
  char cVar1;
  type tVar2;
  int iVar3;
  function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)> *this_00;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  Error error;
  ByteArray datasetList;
  writer write;
  anon_class_32_1_d0c21527 onResponse;
  Request request;
  undefined1 local_1e8 [8];
  pointer local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  string local_1c0;
  type local_1a0;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  parse_func local_150 [1];
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  ByteArray local_120;
  writer local_108;
  _Any_data local_100;
  code *local_f0;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  char local_c8 [16];
  Message local_b8;
  
  local_198 = local_188;
  local_1a0 = 0;
  local_190 = 0;
  local_188[0] = 0;
  coap::Message::Message(&local_b8,kConfirmable,kPost);
  GetBbrDatasetTlvs(&local_120,aDatasetFlags);
  std::function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)>::function
            ((function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)> *)
             &local_100,aHandler);
  iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
  if ((char)iVar3 == '\0') {
    local_178 = (undefined1  [8])((ulong)local_178 & 0xffffffff00000000);
    local_170._M_p = "the commissioner is not active";
    local_168 = 0x1e;
    local_160._M_allocated_capacity = 0;
    local_150[0] = (parse_func)0x0;
    pcVar6 = "the commissioner is not active";
    local_160._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_178;
    do {
      pcVar4 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_178);
      }
      pcVar6 = pcVar4;
    } while (pcVar4 != "");
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_178;
    ::fmt::v10::vformat_abi_cxx11_(&local_1c0,(v10 *)0x249d58,(string_view)ZEXT816(0x1e),args_00);
    local_1e8._0_4_ = 0xf;
    local_1e0 = (pointer)(local_1d8._M_local_buf + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,local_1c0._M_dataplus._M_p,
               local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
    local_1a0 = local_1e8._0_4_;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1e0);
    if (local_1e0 != (pointer)(local_1d8._M_local_buf + 8)) {
LAB_001c0345:
      operator_delete(local_1e0);
    }
LAB_001c034a:
    paVar5 = &local_1c0.field_2;
  }
  else {
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 == '\0') {
      local_178 = (undefined1  [8])((ulong)local_178 & 0xffffffff00000000);
      pcVar6 = "sending MGMT_BBR_GET.req is only valid in CCM mode";
      local_170._M_p = "sending MGMT_BBR_GET.req is only valid in CCM mode";
      local_168 = 0x32;
      local_160._M_allocated_capacity = 0;
      local_150[0] = (parse_func)0x0;
      local_160._8_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_178;
      local_108.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_178;
      do {
        cVar1 = *pcVar6;
        pcVar4 = pcVar6;
        while (cVar1 != '{') {
          pcVar4 = pcVar4 + 1;
          if (pcVar4 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_108,pcVar6,"");
            goto LAB_001c04e4;
          }
          cVar1 = *pcVar4;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_108,pcVar6,pcVar4);
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_178);
      } while (pcVar6 != "");
LAB_001c04e4:
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_178;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1c0,(v10 *)"sending MGMT_BBR_GET.req is only valid in CCM mode",
                 (string_view)ZEXT816(0x32),args_01);
      local_1e8._0_4_ = 0xf;
      local_1e0 = (pointer)(local_1d8._M_local_buf + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,local_1c0._M_dataplus._M_p,
                 local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
      local_1a0 = local_1e8._0_4_;
      std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1e0);
      if (local_1e0 != (pointer)(local_1d8._M_local_buf + 8)) goto LAB_001c0345;
      goto LAB_001c034a;
    }
    local_1e8 = (undefined1  [8])&local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"/c/bg","");
    coap::Message::SetUriPath((Error *)local_178,&local_b8,(string *)local_1e8);
    local_1a0 = local_178._0_4_;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_170);
    tVar2 = local_1a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_p != &local_160) {
      operator_delete(local_170._M_p);
    }
    if (local_1e8 != (undefined1  [8])&local_1d8) {
      operator_delete((void *)local_1e8);
    }
    if (tVar2 != none_type) goto LAB_001c035d;
    if (local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      tlv::Tlv::Tlv((Tlv *)local_1e8,kGet,&local_120,kMeshCoP);
      AppendTlv((Error *)local_178,&local_b8,(Tlv *)local_1e8);
      local_1a0 = local_178._0_4_;
      std::__cxx11::string::operator=((string *)&local_198,(string *)&local_170);
      tVar2 = local_1a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_p != &local_160) {
        operator_delete(local_170._M_p);
      }
      if (local_1e0 != (pointer)0x0) {
        operator_delete(local_1e0);
      }
      if (tVar2 != none_type) goto LAB_001c035d;
    }
    local_138 = (code *)0x0;
    pcStack_130 = (code *)0x0;
    local_148._M_unused._M_object = (void *)0x0;
    local_148._8_8_ = 0;
    this_00 = (function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)> *)
              operator_new(0x20);
    std::function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)>::function
              (this_00,(function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)>
                        *)&local_100);
    pcStack_130 = std::
                  _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:824:23)>
                  ::_M_invoke;
    local_138 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:824:23)>
                ::_M_manager;
    local_148._M_unused._M_object = this_00;
    ProxyClient::SendRequest
              (&this->mProxyClient,&local_b8,(ResponseHandler *)&local_148,0xfc00,0xf0bf);
    if (local_138 != (code *)0x0) {
      (*local_138)(&local_148,&local_148,__destroy_functor);
    }
    local_1e8 = (undefined1  [8])&local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"mgmt","");
    local_178 = (undefined1  [8])((ulong)(uint)local_178._4_4_ << 0x20);
    local_170._M_p = "sent MGMT_BBR_GET.req";
    local_168 = 0x15;
    local_160._M_allocated_capacity = 0;
    local_150[0] = (parse_func)0x0;
    pcVar6 = "sent MGMT_BBR_GET.req";
    local_160._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_178;
    do {
      pcVar4 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_178);
      }
      pcVar6 = pcVar4;
    } while (pcVar4 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_178;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1c0,(v10 *)"sent MGMT_BBR_GET.req",(string_view)ZEXT816(0x15),args);
    Log(kDebug,(string *)local_1e8,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    paVar5 = &local_1d8;
    local_1c0._M_dataplus._M_p = (pointer)local_1e8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar5) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
LAB_001c035d:
  if (local_1a0 != none_type) {
    local_e0._0_4_ = local_1a0;
    local_d8._M_p = local_c8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_198,local_198 + local_190);
    local_178 = (undefined1  [8])0x0;
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)((_Any_data *)aHandler,(BbrDataset **)local_178,(Error *)local_e0);
    if (local_d8._M_p != local_c8) {
      operator_delete(local_d8._M_p);
    }
  }
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,__destroy_functor);
  }
  if (local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  return;
}

Assistant:

void CommissionerImpl::GetBbrDataset(Handler<BbrDataset> aHandler, uint16_t aDatasetFlags)
{
    Error error;

    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    ByteArray     datasetList = GetBbrDatasetTlvs(aDatasetFlags);

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error      error;
        BbrDataset dataset;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        SuccessOrExit(error = DecodeBbrDataset(dataset, *aResponse));

        aHandler(&dataset, error);

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("sending MGMT_BBR_GET.req is only valid in CCM mode"));

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtBbrGet));

    if (!datasetList.empty())
    {
        SuccessOrExit(error = AppendTlv(request, {tlv::Type::kGet, datasetList}));
    }

    mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_BBR_GET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}